

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O3

PartitionGlobalMergeStates * __thiscall
duckdb::AsOfGlobalSourceState::GetMergeStates(AsOfGlobalSourceState *this)

{
  int iVar1;
  type sink;
  PartitionGlobalMergeStates *this_00;
  type pPVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar1 == 0) {
    if ((this->merge_states).
        super_unique_ptr<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PartitionGlobalMergeStates_*,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
        .super__Head_base<0UL,_duckdb::PartitionGlobalMergeStates_*,_false>._M_head_impl ==
        (PartitionGlobalMergeStates *)0x0) {
      sink = unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
             ::operator*(&this->gsink->lhs_sink);
      this_00 = (PartitionGlobalMergeStates *)operator_new(0x18);
      PartitionGlobalMergeStates::PartitionGlobalMergeStates(this_00,sink);
      ::std::
      __uniq_ptr_impl<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
      ::reset((__uniq_ptr_impl<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
               *)&this->merge_states,this_00);
    }
    pPVar2 = unique_ptr<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>,_true>
             ::operator*(&this->merge_states);
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return pPVar2;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

PartitionGlobalMergeStates &GetMergeStates() {
		lock_guard<mutex> guard(lock);
		if (!merge_states) {
			merge_states = make_uniq<PartitionGlobalMergeStates>(*gsink.lhs_sink);
		}
		return *merge_states;
	}